

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QToolBar_*>::data(QList<QToolBar_*> *this)

{
  QArrayDataPointer<QToolBar_*> *this_00;
  QToolBar **ppQVar1;
  QArrayDataPointer<QToolBar_*> *in_RDI;
  
  detach((QList<QToolBar_*> *)0x6fb78c);
  this_00 = (QArrayDataPointer<QToolBar_*> *)QArrayDataPointer<QToolBar_*>::operator->(in_RDI);
  ppQVar1 = QArrayDataPointer<QToolBar_*>::data(this_00);
  return ppQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }